

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsdl-parser.hpp
# Opt level: O1

void __thiscall
yactfr::internal::TsdlParser::_validateFlIntTypeMapping<yactfr::FixedLengthUnsignedIntegerType>
          (TsdlParser *this,Size len,TextLocation *loc,string *name,MappingRangeSet *ranges)

{
  string msg;
  char *pcVar1;
  _Base_ptr p_Var2;
  ostream *poVar3;
  _Rb_tree_header *p_Var4;
  _Base_ptr p_Var5;
  ostringstream ss;
  undefined8 in_stack_fffffffffffffe30;
  TextLocation in_stack_fffffffffffffe38;
  ostringstream local_1a8 [376];
  
  p_Var2 = (ranges->_ranges)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(ranges->_ranges)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var4) {
    p_Var5 = (_Base_ptr)~(-1L << ((byte)len & 0x3f));
    if (0x3f < len) {
      p_Var5 = (_Base_ptr)0xffffffffffffffff;
    }
    do {
      if (p_Var5 < p_Var2[1]._M_parent) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"In mapping `",0xc);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(name->_M_dataplus)._M_p,name->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"` of enumeration type: at least one value of the range [",0x38);
        poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
        poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] doesn\'t fit the range [",0x19)
        ;
        poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
        poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] (with a length of ",0x14);
        poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," bit",4);
        pcVar1 = ".[\\*^$\n";
        if (len != 1) {
          pcVar1 = "offset_s";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar1 + 7,(ulong)(len != 1));
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,").",2);
        std::__cxx11::stringbuf::str();
        msg.field_2._8_8_ = in_stack_fffffffffffffe30;
        msg._0_24_ = *loc;
        throwTextParseError(msg,in_stack_fffffffffffffe38);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var4);
  }
  return;
}

Assistant:

void TsdlParser::_validateFlIntTypeMapping(const Size len, const TextLocation& loc,
                                           const std::string& name,
                                           const typename FlIntTypeT::MappingRangeSet& ranges) const
{
    using Value = typename FlIntTypeT::MappingValue;

    for (auto& range : ranges) {
        // validate range storage length
        Value minLower, maxUpper;

        if (std::is_signed<Value>::value) {
            if (len < 63) {
                minLower = -(1LL << (len - 1));
                maxUpper = (1LL << (len - 1)) - 1;
            } else {
                minLower = std::numeric_limits<Value>::min();
                maxUpper = std::numeric_limits<Value>::max();
            }
        } else {
            minLower = std::numeric_limits<Value>::min();

            if (len < 64) {
                maxUpper = (1ULL << len) - 1;
            } else {
                maxUpper = std::numeric_limits<Value>::max();
            }
        }

        if (range.lower() < minLower || range.upper() > maxUpper) {
            std::ostringstream ss;

            ss << "In mapping `" << name << "` of enumeration type: "
                  "at least one value of the range [" << range.lower() <<
                  ", " << range.upper() <<
                  "] doesn't fit the range [" << minLower << ", " << maxUpper << "] "
                  "(with a length of " << len << " bit" << ((len == 1) ? "" : "s") << ").";
            throwTextParseError(ss.str(), loc);
        }
    }
}